

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void urpp_test(void)

{
  char *alternative;
  char *type;
  double x [100];
  double pval;
  double stat;
  undefined4 local_10;
  int lshort;
  int k;
  int N;
  
  memcpy(&type,&DAT_0017c8d0,800);
  lshort = 100;
  local_10 = 0;
  stat._4_4_ = 1;
  ur_pp((double *)&type,100,"stationary","Z(t_alpha)",1,(int *)0x0,&pval,x + 99);
  printf("Stats %g PVAL %g \n",pval,x[99]);
  return;
}

Assistant:

void urpp_test() {
	int N,k,lshort;
	double stat, pval;

	double x[100] = { -0.5604756, -0.2301775, 1.558708, 0.07050839, 0.1292877, 1.715065, 0.4609162, -1.265061, -0.6868529, -0.445662,
		1.224082, 0.3598138, 0.4007715, 0.1106827, -0.5558411, 1.786913, 0.4978505, -1.966617, 0.7013559, -0.4727914, -1.067824, -0.2179749,
		-1.026004, -0.7288912, -0.6250393, -1.686693, 0.837787, 0.1533731, -1.138137, 1.253815, 0.4264642, -0.2950715, 0.8951257, 0.8781335, 0.8215811,
		0.6886403, 0.5539177, -0.06191171, -0.3059627, -0.380471, -0.694707, -0.2079173, -1.265396, 2.168956, 1.207962, -1.123109, -0.4028848, -0.4666554,
		0.7799651, -0.08336907, 0.2533185, -0.02854676, -0.04287046, 1.368602, -0.225771, 1.516471, -1.548753, 0.5846137, 0.1238542, 0.2159416, 0.3796395,
		-0.5023235, -0.3332074, -1.018575, -1.071791, 0.3035286, 0.4482098, 0.05300423, 0.9222675, 2.050085, -0.4910312, -2.309169, 1.005739, -0.7092008,
		-0.6880086, 1.025571, -0.284773, -1.220718, 0.1813035, -0.1388914, 0.005764186, 0.3852804, -0.37066, 0.6443765, -0.2204866, 0.331782, 1.096839,
		0.4351815, -0.3259316, 1.148808, 0.9935039, 0.548397, 0.2387317, -0.6279061, 1.360652, -0.6002596, 2.187333, 1.532611, -0.2357004, -1.026421 };
	
	N = 100;
	k = 0;
	const char* type = "Z(t_alpha)";
	const char* alternative = "stationary";
	lshort = 1;

	ur_pp(x,N,alternative,type,lshort,NULL, &stat,&pval);

	printf("Stats %g PVAL %g \n",stat,pval);
}